

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

DockPosition toDockPos(DockWidgetArea area)

{
  DockWidgetArea area_local;
  DockPosition local_4;
  
  switch(area) {
  case LeftDockWidgetArea:
    local_4 = LeftDock;
    break;
  case RightDockWidgetArea:
    local_4 = RightDock;
    break;
  default:
    local_4 = DockCount;
    break;
  case TopDockWidgetArea:
    local_4 = TopDock;
    break;
  case BottomDockWidgetArea:
    local_4 = BottomDock;
  }
  return local_4;
}

Assistant:

static QInternal::DockPosition toDockPos(Qt::DockWidgetArea area)
{
    switch (area) {
        case Qt::LeftDockWidgetArea: return QInternal::LeftDock;
        case Qt::RightDockWidgetArea: return QInternal::RightDock;
        case Qt::TopDockWidgetArea: return QInternal::TopDock;
        case Qt::BottomDockWidgetArea: return QInternal::BottomDock;
        default:
            break;
    }

    return QInternal::DockCount;
}